

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  char cVar1;
  byte bVar2;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this_00;
  
  this_00 = in_RDI;
  cVar1 = ::SafeInt::operator_cast_to_signed_char(in_RDI);
  if (cVar1 < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17b3,
                  "SafeInt<T, E> &SafeInt<char>::operator>>=(SafeInt<U, E>) [T = char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = signed char]"
                 );
  }
  cVar1 = ::SafeInt::operator_cast_to_signed_char(this_00);
  if (cVar1 < '\b') {
    bVar2 = ::SafeInt::operator_cast_to_signed_char(this_00);
    in_RDI->m_int = (char)((int)in_RDI->m_int >> (bVar2 & 0x1f));
    return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)in_RDI;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17b4,
                "SafeInt<T, E> &SafeInt<char>::operator>>=(SafeInt<U, E>) [T = char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = signed char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= (U)bits;
        return *this;
    }